

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O2

void __thiscall
Assimp::ASEImporter::BuildNodes
          (ASEImporter *this,
          vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *nodes)

{
  pointer ppBVar1;
  BaseNode *snode;
  aiScene *paVar2;
  __type _Var3;
  uint i_1;
  uint uVar4;
  aiNode *paVar5;
  aiNode **ppaVar6;
  aiNode *this_00;
  DeadlyImportError *this_01;
  pointer ppBVar7;
  pointer ppBVar8;
  long lVar9;
  pointer ppBVar10;
  uint i;
  ulong uVar11;
  vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *__range1;
  pointer ppaVar12;
  pointer ppaVar13;
  ulong uVar14;
  aiNode *pcNode;
  vector<aiNode_*,_std::allocator<aiNode_*>_> apcNodes;
  vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_> aiList;
  
  if (this->pcScene == (aiScene *)0x0) {
    __assert_fail("__null != pcScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/ASE/ASELoader.cpp"
                  ,0x287,"void Assimp::ASEImporter::BuildNodes(std::vector<BaseNode *> &)");
  }
  paVar5 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar5);
  this->pcScene->mRootNode = paVar5;
  aiString::Set((aiString *)paVar5,"<ASERoot>");
  this->pcScene->mRootNode->mNumChildren = 1;
  ppaVar6 = (aiNode **)operator_new__(8);
  this->pcScene->mRootNode->mChildren = ppaVar6;
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  *this->pcScene->mRootNode->mChildren = this_00;
  this_00->mParent = paVar5;
  ppBVar1 = (nodes->
            super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar8 = (nodes->
                 super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppBVar8 != ppBVar1;
      ppBVar8 = ppBVar8 + 1) {
    aiMatrix4x4t<float>::Transpose(&(*ppBVar8)->mTransform);
  }
  AddNodes(this,nodes,this_00,(char *)0x0);
  aiList.
  super__Vector_base<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aiList.
  super__Vector_base<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  aiList.
  super__Vector_base<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppBVar8 = (nodes->
            super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppBVar1 = (nodes->
            super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppBVar8 == ppBVar1) {
      if (aiList.
          super__Vector_base<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          aiList.
          super__Vector_base<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<aiNode_*,_std::allocator<aiNode_*>_>::reserve
                  (&apcNodes,
                   (ulong)this->pcScene->mRootNode->mNumChildren +
                   ((long)aiList.
                          super__Vector_base<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)aiList.
                          super__Vector_base<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        lVar9 = 0;
        for (uVar11 = 0; paVar5 = this->pcScene->mRootNode, ppaVar6 = paVar5->mChildren,
            uVar11 < paVar5->mNumChildren; uVar11 = uVar11 + 1) {
          std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                    (&apcNodes,(value_type *)((long)ppaVar6 + lVar9));
          lVar9 = lVar9 + 8;
        }
        ppBVar10 = aiList.
                   super__Vector_base<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (ppaVar6 != (aiNode **)0x0) {
          operator_delete__(ppaVar6);
          ppBVar10 = aiList.
                     super__Vector_base<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        }
        for (; ppaVar13 = apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                          super__Vector_impl_data._M_finish,
            ppaVar12 = apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                       super__Vector_impl_data._M_start,
            ppBVar10 !=
            aiList.
            super__Vector_base<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish; ppBVar10 = ppBVar10 + 1) {
          snode = *ppBVar10;
          paVar5 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(paVar5);
          paVar5->mParent = this->pcScene->mRootNode;
          uVar11 = (snode->mName)._M_string_length;
          pcNode = paVar5;
          if (uVar11 < 0x400) {
            (paVar5->mName).length = (ai_uint32)uVar11;
            memcpy((paVar5->mName).data,(snode->mName)._M_dataplus._M_p,uVar11);
            (paVar5->mName).data[uVar11] = '\0';
          }
          AddMeshes(this,snode,paVar5);
          AddNodes(this,nodes,pcNode,(pcNode->mName).data);
          std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back(&apcNodes,&pcNode);
        }
        uVar11 = 0xffffffffffffffff;
        if (-1 < (long)apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                       super__Vector_impl_data._M_start) {
          uVar11 = (long)apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                         super__Vector_impl_data._M_start;
        }
        ppaVar6 = (aiNode **)operator_new__(uVar11);
        this->pcScene->mRootNode->mChildren = ppaVar6;
        uVar4 = 0;
        while( true ) {
          uVar11 = (ulong)uVar4;
          uVar14 = (long)ppaVar13 - (long)ppaVar12 >> 3;
          if (uVar14 <= uVar11) break;
          this->pcScene->mRootNode->mChildren[uVar11] = ppaVar12[uVar11];
          uVar4 = uVar4 + 1;
          ppaVar12 = apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppaVar13 = apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        }
        this->pcScene->mRootNode->mNumChildren = (uint)uVar14;
        std::_Vector_base<aiNode_*,_std::allocator<aiNode_*>_>::~_Vector_base
                  (&apcNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>);
      }
      for (uVar11 = 0; paVar2 = this->pcScene, uVar11 < paVar2->mNumMeshes; uVar11 = uVar11 + 1) {
        paVar2->mMeshes[uVar11]->mColors[2] = (aiColor4D *)0x0;
      }
      paVar5 = paVar2->mRootNode;
      if (paVar5->mNumChildren == 0) {
        this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&apcNodes,"ASE: No nodes loaded. The file is either empty or corrupt",
                   (allocator<char> *)&pcNode);
        DeadlyImportError::DeadlyImportError(this_01,(string *)&apcNodes);
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      (paVar5->mTransformation).a1 = 1.0;
      (paVar5->mTransformation).a2 = 0.0;
      (paVar5->mTransformation).a3 = 0.0;
      (paVar5->mTransformation).a4 = 0.0;
      (paVar5->mTransformation).b1 = 0.0;
      (paVar5->mTransformation).b2 = 0.0;
      (paVar5->mTransformation).b3 = 1.0;
      (paVar5->mTransformation).b4 = 0.0;
      (paVar5->mTransformation).c1 = 0.0;
      (paVar5->mTransformation).c2 = -1.0;
      (paVar5->mTransformation).c3 = 0.0;
      (paVar5->mTransformation).c4 = 0.0;
      (paVar5->mTransformation).d1 = 0.0;
      (paVar5->mTransformation).d2 = 0.0;
      (paVar5->mTransformation).d3 = 0.0;
      (paVar5->mTransformation).d4 = 1.0;
      std::
      _Vector_base<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>::
      ~_Vector_base(&aiList.
                     super__Vector_base<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>
                   );
      return;
    }
    if ((*ppBVar8)->mProcessed == false) {
      for (ppBVar7 = (nodes->
                     super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>
                     )._M_impl.super__Vector_impl_data._M_start; ppBVar7 != ppBVar1;
          ppBVar7 = ppBVar7 + 1) {
        if ((ppBVar7 != ppBVar8) &&
           (_Var3 = std::operator==(&(*ppBVar7)->mName,&(*ppBVar8)->mParent), _Var3))
        goto LAB_003ceadf;
      }
      std::vector<const_Assimp::ASE::BaseNode_*,_std::allocator<const_Assimp::ASE::BaseNode_*>_>::
      push_back(&aiList,ppBVar8);
    }
LAB_003ceadf:
    ppBVar8 = ppBVar8 + 1;
  } while( true );
}

Assistant:

void ASEImporter::BuildNodes(std::vector<BaseNode*>& nodes) {
    ai_assert(NULL != pcScene);

    // allocate the one and only root node
    aiNode* root = pcScene->mRootNode = new aiNode();
    root->mName.Set("<ASERoot>");

    // Setup the coordinate system transformation
    pcScene->mRootNode->mNumChildren = 1;
    pcScene->mRootNode->mChildren = new aiNode*[1];
    aiNode* ch = pcScene->mRootNode->mChildren[0] = new aiNode();
    ch->mParent = root;

    // Change the transformation matrix of all nodes
    for (BaseNode *node : nodes) {
        aiMatrix4x4& m = node->mTransform;
        m.Transpose(); // row-order vs column-order
    }

    // add all nodes
    AddNodes(nodes,ch,NULL);

    // now iterate through al nodes and find those that have not yet
    // been added to the nodegraph (= their parent could not be recognized)
    std::vector<const BaseNode*> aiList;
    for (std::vector<BaseNode*>::iterator it = nodes.begin(), end = nodes.end();it != end; ++it)    {
        if ((*it)->mProcessed) {
            continue;
        }

        // check whether our parent is known
        bool bKnowParent = false;

        // search the list another time, starting *here* and try to find out whether
        // there is a node that references *us* as a parent
        for (std::vector<BaseNode*>::const_iterator it2 = nodes.begin();it2 != end; ++it2) {
            if (it2 == it) {
                continue;
            }

            if ((*it2)->mName == (*it)->mParent)    {
                bKnowParent = true;
                break;
            }
        }
        if (!bKnowParent)   {
            aiList.push_back(*it);
        }
    }

    // Are there ane orphaned nodes?
    if (!aiList.empty())    {
        std::vector<aiNode*> apcNodes;
        apcNodes.reserve(aiList.size() + pcScene->mRootNode->mNumChildren);

        for (unsigned int i = 0; i < pcScene->mRootNode->mNumChildren;++i)
            apcNodes.push_back(pcScene->mRootNode->mChildren[i]);

        delete[] pcScene->mRootNode->mChildren;
        for (std::vector<const BaseNode*>::/*const_*/iterator i =  aiList.begin();i != aiList.end();++i)    {
            const ASE::BaseNode* src = *i;

            // The parent is not known, so we can assume that we must add
            // this node to the root node of the whole scene
            aiNode* pcNode = new aiNode();
            pcNode->mParent = pcScene->mRootNode;
            pcNode->mName.Set(src->mName);
            AddMeshes(src,pcNode);
            AddNodes(nodes,pcNode,pcNode->mName.data);
            apcNodes.push_back(pcNode);
        }

        // Regenerate our output array
        pcScene->mRootNode->mChildren = new aiNode*[apcNodes.size()];
        for (unsigned int i = 0; i < apcNodes.size();++i)
            pcScene->mRootNode->mChildren[i] = apcNodes[i];

        pcScene->mRootNode->mNumChildren = (unsigned int)apcNodes.size();
    }

    // Reset the third color set to NULL - we used this field to store a temporary pointer
    for (unsigned int i = 0; i < pcScene->mNumMeshes;++i)
        pcScene->mMeshes[i]->mColors[2] = NULL;

    // The root node should not have at least one child or the file is valid
    if (!pcScene->mRootNode->mNumChildren) {
        throw DeadlyImportError("ASE: No nodes loaded. The file is either empty or corrupt");
    }

    // Now rotate the whole scene 90 degrees around the x axis to convert to internal coordinate system
    pcScene->mRootNode->mTransformation = aiMatrix4x4(1.f,0.f,0.f,0.f,
        0.f,0.f,1.f,0.f,0.f,-1.f,0.f,0.f,0.f,0.f,0.f,1.f);
}